

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wiener.cxx
# Opt level: O3

string * __thiscall Wiener::getParameter(string *__return_storage_ptr__,Wiener *this,string *name)

{
  int iVar1;
  double dVar2;
  stringstream param;
  string local_1c0;
  stringstream local_1a0 [16];
  undefined1 local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 == 0) {
    dVar2 = this->wienerMean / (this->wienerSqrtDt * this->wienerSqrtDt);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 != 0) {
      Parametric::getParameter(&local_1c0,(Parametric *)this,name);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0014af4e;
    }
    dVar2 = this->wienerStdDev * this->wienerStdDev;
  }
  std::ostream::_M_insert<double>(dVar2);
LAB_0014af4e:
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

string Wiener::getParameter(const string& name) const
{
	stringstream param;
if (name == "mean")
		param << wienerMean / (wienerSqrtDt * wienerSqrtDt);
	else if (name == "variance")
		param << wienerStdDev*wienerStdDev;
	else
		param << StochasticVariable::getParameter(name);
		
	return param.str();
}